

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_poly_test.c
# Opt level: O2

void test_poly_default(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  void *pvVar5;
  nng_socket local_34;
  nng_socket local_30;
  nng_socket c1;
  nng_socket c2;
  nng_socket s1;
  nng_msg *msg;
  
  nVar1 = nng_pair1_open_poly(&c1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x95,"%s: expected success, got %s (%d)","nng_pair1_open_poly(&s1)",pcVar3
                         ,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_pair1_open(&local_34);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                           ,0x96,"%s: expected success, got %s (%d)","nng_pair1_open(&c1)",pcVar3,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_pair1_open(&local_30);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                             ,0x97,"%s: expected success, got %s (%d)","nng_pair1_open(&c2)",pcVar3,
                             nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_ms(c1,"send-timeout",1000);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                               ,0x98,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, SECOND)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_set_ms(local_34,"send-timeout",1000);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                 ,0x99,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(c1, NNG_OPT_SENDTIMEO, SECOND)",pcVar3,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_set_ms(local_30,"send-timeout",1000);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                   ,0x9a,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(c2, NNG_OPT_SENDTIMEO, SECOND)",pcVar3,nVar1);
            if (iVar2 != 0) {
              nVar1 = nuts_marry(c1,local_34);
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                     ,0x9c,"%s: expected success, got %s (%d)","nuts_marry(s1, c1)",
                                     pcVar3,nVar1);
              if (iVar2 != 0) {
                nVar1 = nuts_marry(c1,local_30);
                pcVar3 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                       ,0x9d,"%s: expected success, got %s (%d)",
                                       "nuts_marry(s1, c2)",pcVar3,nVar1);
                if (iVar2 != 0) {
                  nVar1 = nng_msg_alloc((nng_msg **)&c2,0);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                         ,0xa1,"%s: expected success, got %s (%d)",
                                         "nng_msg_alloc(&msg, 0)",pcVar3,nVar1);
                  if (iVar2 != 0) {
                    nVar1 = nng_msg_append(_c2,"YES",3);
                    pcVar3 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                           ,0xa2,"%s: expected success, got %s (%d)",
                                           "nng_msg_append(msg, \"YES\", strlen(\"YES\"))",pcVar3,
                                           nVar1);
                    if (iVar2 != 0) {
                      nVar1 = nng_sendmsg(c1,_c2,0);
                      pcVar3 = nng_strerror(nVar1);
                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                             ,0xa3,"%s: expected success, got %s (%d)",
                                             "nng_sendmsg(s1, msg, 0)",pcVar3,nVar1);
                      if (iVar2 != 0) {
                        nVar1 = nng_recvmsg(local_34,(nng_msg **)&c2,0);
                        pcVar3 = nng_strerror(nVar1);
                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                               ,0xa4,"%s: expected success, got %s (%d)",
                                               "nng_recvmsg(c1, &msg, 0)",pcVar3,nVar1);
                        if (iVar2 != 0) {
                          sVar4 = nng_msg_len(_c2);
                          acutest_check_((uint)(sVar4 == 3),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                         ,0xa5,"%s","nng_msg_len(msg) == strlen(\"YES\")");
                          pvVar5 = nng_msg_body(_c2);
                          iVar2 = bcmp(pvVar5,"YES",3);
                          acutest_check_((uint)(iVar2 == 0),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                         ,0xa5,"%s",
                                         "memcmp(nng_msg_body(msg), \"YES\", strlen(\"YES\")) == 0")
                          ;
                          nng_msg_free(_c2);
                          nVar1 = nng_socket_close(local_34);
                          pcVar3 = nng_strerror(nVar1);
                          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                                 ,0xa8,"%s: expected success, got %s (%d)",
                                                 "nng_socket_close(c1)",pcVar3,nVar1);
                          if (iVar2 != 0) {
                            nuts_sleep(10);
                            nVar1 = nng_msg_alloc((nng_msg **)&c2,0);
                            pcVar3 = nng_strerror(nVar1);
                            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                                  ,0xac,"%s: expected success, got %s (%d)",
                                                  "nng_msg_alloc(&msg, 0)",pcVar3,nVar1);
                            if (iVar2 != 0) {
                              nVar1 = nng_msg_append(_c2,"AGAIN",5);
                              pcVar3 = nng_strerror(nVar1);
                              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                                  ,0xad,"%s: expected success, got %s (%d)",
                                                  "nng_msg_append(msg, \"AGAIN\", strlen(\"AGAIN\"))"
                                                  ,pcVar3,nVar1);
                              if (iVar2 != 0) {
                                nVar1 = nng_sendmsg(c1,_c2,0);
                                pcVar3 = nng_strerror(nVar1);
                                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                                  ,0xae,"%s: expected success, got %s (%d)",
                                                  "nng_sendmsg(s1, msg, 0)",pcVar3,nVar1);
                                if (iVar2 != 0) {
                                  nVar1 = nng_recvmsg(local_30,(nng_msg **)&c2,0);
                                  pcVar3 = nng_strerror(nVar1);
                                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                                  ,0xaf,"%s: expected success, got %s (%d)",
                                                  "nng_recvmsg(c2, &msg, 0)",pcVar3,nVar1);
                                  if (iVar2 != 0) {
                                    sVar4 = nng_msg_len(_c2);
                                    acutest_check_((uint)(sVar4 == 5),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                                  ,0xb0,"%s","nng_msg_len(msg) == strlen(\"AGAIN\")"
                                                  );
                                    pvVar5 = nng_msg_body(_c2);
                                    iVar2 = bcmp(pvVar5,"AGAIN",5);
                                    acutest_check_((uint)(iVar2 == 0),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                                  ,0xb0,"%s",
                                                  "memcmp(nng_msg_body(msg), \"AGAIN\", strlen(\"AGAIN\")) == 0"
                                                  );
                                    nng_msg_free(_c2);
                                    nVar1 = nng_socket_close(c1);
                                    pcVar3 = nng_strerror(nVar1);
                                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                                  ,0xb3,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(s1)",pcVar3,nVar1);
                                    if (iVar2 != 0) {
                                      nVar1 = nng_socket_close(local_30);
                                      pcVar3 = nng_strerror(nVar1);
                                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                                  ,0xb4,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(c2)",pcVar3,nVar1);
                                      if (iVar2 != 0) {
                                        return;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_poly_default(void)
{
	nng_socket s1;
	nng_socket c1;
	nng_socket c2;
	nng_msg   *msg;

	NUTS_PASS(nng_pair1_open_poly(&s1));
	NUTS_PASS(nng_pair1_open(&c1));
	NUTS_PASS(nng_pair1_open(&c2));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(c1, NNG_OPT_SENDTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(c2, NNG_OPT_SENDTIMEO, SECOND));

	NUTS_MARRY(s1, c1);
	NUTS_MARRY(s1, c2);

	// This assumes poly picks the first suitor.  Applications
	// should not make the same assumption.
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	APPEND_STR(msg, "YES");
	NUTS_PASS(nng_sendmsg(s1, msg, 0));
	NUTS_PASS(nng_recvmsg(c1, &msg, 0));
	CHECK_STR(msg, "YES");
	nng_msg_free(msg);

	NUTS_CLOSE(c1);
	NUTS_SLEEP(10);

	// Verify that the other pipe is chosen as the next suitor.
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	APPEND_STR(msg, "AGAIN");
	NUTS_PASS(nng_sendmsg(s1, msg, 0));
	NUTS_PASS(nng_recvmsg(c2, &msg, 0));
	CHECK_STR(msg, "AGAIN");
	nng_msg_free(msg);

	NUTS_CLOSE(s1);
	NUTS_CLOSE(c2);
}